

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

loader_handle_impl
loader_impl_load_handle
          (loader_impl impl,loader_impl_interface iface,loader_handle module,char *path,size_t size)

{
  loader_handle_impl __ptr;
  context pcVar1;
  vector pvVar2;
  
  __ptr = (loader_handle_impl)malloc(0x1038);
  if (__ptr != (loader_handle_impl)0x0) {
    __ptr->impl = impl;
    __ptr->iface = iface;
    strncpy(__ptr->path,path,size);
    __ptr->module = module;
    pcVar1 = (context)context_create(__ptr->path);
    __ptr->ctx = pcVar1;
    if (pcVar1 != (context)0x0) {
      pvVar2 = (vector)vector_create(8);
      __ptr->populated_handles = pvVar2;
      if (pvVar2 != (vector)0x0) {
        __ptr->magic = (uintptr_t)"loader_handle_impl_magic_alloc";
        return __ptr;
      }
      context_destroy(__ptr->ctx);
    }
    free(__ptr);
  }
  return (loader_handle_impl)0x0;
}

Assistant:

loader_handle_impl loader_impl_load_handle(loader_impl impl, loader_impl_interface iface, loader_handle module, const char *path, size_t size)
{
	loader_handle_impl handle_impl = malloc(sizeof(struct loader_handle_impl_type));

	if (handle_impl == NULL)
	{
		goto alloc_loader_handle_impl_error;
	}

	handle_impl->impl = impl;
	handle_impl->iface = iface;
	strncpy(handle_impl->path, path, size);
	handle_impl->module = module;
	handle_impl->ctx = context_create(handle_impl->path);

	if (handle_impl->ctx == NULL)
	{
		goto alloc_context_error;
	}

	handle_impl->populated_handles = vector_create_type(loader_handle_impl);

	if (handle_impl->populated_handles == NULL)
	{
		goto alloc_populated_handles_error;
	}

	handle_impl->magic = (uintptr_t)loader_handle_impl_magic_alloc;

	return handle_impl;

alloc_populated_handles_error:
	context_destroy(handle_impl->ctx);
alloc_context_error:
	handle_impl->magic = (uintptr_t)loader_handle_impl_magic_free;
	free(handle_impl);
alloc_loader_handle_impl_error:
	return NULL;
}